

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crosser.cc
# Opt level: O1

int __thiscall S2EdgeCrosser::CrossingSignInternal2(S2EdgeCrosser *this,S2Point *d)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  S2Point *pSVar4;
  S2Point *pSVar5;
  S2Point *b;
  int iVar6;
  long lVar7;
  double *ap_5;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  Vector3_d c_cross_d;
  Vector3_d local_40;
  S2LogMessage local_28;
  
  if (this->have_tangents_ == false) {
    S2::RobustCrossProd(&local_40,this->a_,this->b_);
    dVar8 = local_40.c_[2] * local_40.c_[2] +
            local_40.c_[1] * local_40.c_[1] + local_40.c_[0] * local_40.c_[0];
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    dVar11 = (double)(~-(ulong)(dVar8 != 0.0) & (ulong)dVar8 |
                     (ulong)(1.0 / dVar8) & -(ulong)(dVar8 != 0.0));
    dVar9 = local_40.c_[0] * dVar11;
    dVar10 = local_40.c_[1] * dVar11;
    dVar11 = dVar11 * local_40.c_[2];
    pSVar4 = this->a_;
    pSVar5 = this->b_;
    dVar8 = pSVar4->c_[0];
    dVar2 = pSVar4->c_[1];
    dVar3 = pSVar4->c_[2];
    (this->a_tangent_).c_[0] = dVar11 * dVar2 - dVar10 * dVar3;
    (this->a_tangent_).c_[1] = dVar3 * dVar9 - dVar11 * dVar8;
    (this->a_tangent_).c_[2] = dVar8 * dVar10 - dVar2 * dVar9;
    dVar8 = pSVar5->c_[2];
    dVar2 = pSVar5->c_[0];
    dVar3 = pSVar5->c_[1];
    (this->b_tangent_).c_[0] = dVar10 * dVar8 - dVar11 * dVar3;
    (this->b_tangent_).c_[1] = dVar11 * dVar2 - dVar8 * dVar9;
    (this->b_tangent_).c_[2] = dVar9 * dVar3 - dVar10 * dVar2;
    this->have_tangents_ = true;
  }
  if (CrossingSignInternal2(Vector3<double>const&)::kError == '\0') {
    CrossingSignInternal2();
  }
  pSVar4 = this->c_;
  dVar8 = pSVar4->c_[0];
  dVar2 = (this->a_tangent_).c_[0];
  dVar3 = (this->a_tangent_).c_[1];
  dVar9 = (this->a_tangent_).c_[2];
  if ((pSVar4->c_[2] * dVar9 + pSVar4->c_[1] * dVar3 + dVar8 * dVar2 + 0.0 <=
       CrossingSignInternal2::kError) ||
     (dVar9 * d->c_[2] + dVar3 * d->c_[1] + dVar2 * d->c_[0] + 0.0 <= CrossingSignInternal2::kError)
     ) {
    dVar2 = (this->b_tangent_).c_[0];
    dVar3 = (this->b_tangent_).c_[1];
    dVar9 = (this->b_tangent_).c_[2];
    if ((pSVar4->c_[2] * dVar9 + pSVar4->c_[1] * dVar3 + dVar8 * dVar2 + 0.0 <=
         CrossingSignInternal2::kError) ||
       (dVar9 * d->c_[2] + dVar3 * d->c_[1] + dVar2 * d->c_[0] + 0.0 <=
        CrossingSignInternal2::kError)) {
      pSVar5 = this->a_;
      dVar2 = pSVar5->c_[0];
      if ((dVar2 == dVar8) && (!NAN(dVar2) && !NAN(dVar8))) {
        lVar7 = 0;
        do {
          if (lVar7 == 0x10) {
            return 0;
          }
          dVar3 = *(double *)((long)pSVar5->c_ + lVar7 + 8);
          pdVar1 = (double *)((long)pSVar4->c_ + lVar7 + 8);
          lVar7 = lVar7 + 8;
        } while ((dVar3 == *pdVar1) && (!NAN(dVar3) && !NAN(*pdVar1)));
      }
      dVar3 = d->c_[0];
      if ((dVar2 == dVar3) && (!NAN(dVar2) && !NAN(dVar3))) {
        lVar7 = 0;
        do {
          if (lVar7 == 0x10) {
            return 0;
          }
          dVar9 = *(double *)((long)pSVar5->c_ + lVar7 + 8);
          pdVar1 = (double *)((long)d->c_ + lVar7 + 8);
          lVar7 = lVar7 + 8;
        } while ((dVar9 == *pdVar1) && (!NAN(dVar9) && !NAN(*pdVar1)));
      }
      b = this->b_;
      dVar9 = b->c_[0];
      if ((dVar9 == dVar8) && (!NAN(dVar9) && !NAN(dVar8))) {
        lVar7 = 0;
        do {
          if (lVar7 == 0x10) {
            return 0;
          }
          dVar10 = *(double *)((long)b->c_ + lVar7 + 8);
          pdVar1 = (double *)((long)pSVar4->c_ + lVar7 + 8);
          lVar7 = lVar7 + 8;
        } while ((dVar10 == *pdVar1) && (!NAN(dVar10) && !NAN(*pdVar1)));
      }
      if ((dVar9 == dVar3) && (!NAN(dVar9) && !NAN(dVar3))) {
        lVar7 = 0;
        do {
          if (lVar7 == 0x10) {
            return 0;
          }
          dVar10 = *(double *)((long)b->c_ + lVar7 + 8);
          pdVar1 = (double *)((long)d->c_ + lVar7 + 8);
          lVar7 = lVar7 + 8;
        } while ((dVar10 == *pdVar1) && (!NAN(dVar10) && !NAN(*pdVar1)));
      }
      if ((dVar2 == dVar9) && (!NAN(dVar2) && !NAN(dVar9))) {
        lVar7 = 0;
        do {
          if (lVar7 == 0x10) {
            return -1;
          }
          dVar2 = *(double *)((long)pSVar5->c_ + lVar7 + 8);
          pdVar1 = (double *)((long)b->c_ + lVar7 + 8);
          lVar7 = lVar7 + 8;
        } while ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1)));
      }
      if ((dVar8 == dVar3) && (!NAN(dVar8) && !NAN(dVar3))) {
        lVar7 = 0;
        do {
          if (lVar7 == 0x10) {
            return -1;
          }
          dVar8 = *(double *)((long)pSVar4->c_ + lVar7 + 8);
          pdVar1 = (double *)((long)d->c_ + lVar7 + 8);
          lVar7 = lVar7 + 8;
        } while ((dVar8 == *pdVar1) && (!NAN(dVar8) && !NAN(*pdVar1)));
      }
      if (this->acb_ == 0) {
        iVar6 = s2pred::ExpensiveSign(pSVar5,b,pSVar4,true);
        this->acb_ = -iVar6;
      }
      if (this->acb_ == 0) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.cc"
                   ,0x49,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_40.c_[1],"Check failed: (acb_) != (0) ",0x1c);
      }
      else {
        if (this->bda_ == 0) {
          iVar6 = s2pred::ExpensiveSign(this->a_,this->b_,d,true);
          this->bda_ = iVar6;
        }
        if (this->bda_ == 0) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)&local_40,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.cc"
                     ,0x4b,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_40.c_[1],"Check failed: (bda_) != (0) ",0x1c);
        }
        else {
          if (this->bda_ != this->acb_) {
            return -1;
          }
          pSVar4 = this->c_;
          local_40.c_[0] = pSVar4->c_[1] * d->c_[2] - pSVar4->c_[2] * d->c_[1];
          local_40.c_[1] = pSVar4->c_[2] * d->c_[0] - d->c_[2] * pSVar4->c_[0];
          local_40.c_[2] = d->c_[1] * pSVar4->c_[0] - pSVar4->c_[1] * d->c_[0];
          iVar6 = s2pred::Sign(pSVar4,d,this->b_,&local_40);
          if (iVar6 == 0) {
            S2LogMessage::S2LogMessage
                      (&local_28,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.cc"
                       ,0x50,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_28.stream_,"Check failed: (cbd) != (0) ",0x1b);
          }
          else {
            if (iVar6 + this->acb_ != 0) {
              return -1;
            }
            iVar6 = s2pred::Sign(this->c_,d,this->a_,&local_40);
            if (iVar6 != 0) {
              return (uint)(iVar6 == this->acb_) * 2 + -1;
            }
            S2LogMessage::S2LogMessage
                      (&local_28,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.cc"
                       ,0x53,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_28.stream_,"Check failed: (dac) != (0) ",0x1b);
          }
        }
      }
      abort();
    }
  }
  return -1;
}

Assistant:

inline int S2EdgeCrosser::CrossingSignInternal2(const S2Point& d) {
  // At this point, a very common situation is that A,B,C,D are four points on
  // a line such that AB does not overlap CD.  (For example, this happens when
  // a line or curve is sampled finely, or when geometry is constructed by
  // computing the union of S2CellIds.)  Most of the time, we can determine
  // that AB and CD do not intersect by computing the two outward-facing
  // tangents at A and B (parallel to AB) and testing whether AB and CD are on
  // opposite sides of the plane perpendicular to one of these tangents.  This
  // is moderately expensive but still much cheaper than s2pred::ExpensiveSign.
  if (!have_tangents_) {
    S2Point norm = S2::RobustCrossProd(*a_, *b_).Normalize();
    a_tangent_ = a_->CrossProd(norm);
    b_tangent_ = norm.CrossProd(*b_);
    have_tangents_ = true;
  }
  // The error in RobustCrossProd() is insignificant.  The maximum error in
  // the call to CrossProd() (i.e., the maximum norm of the error vector) is
  // (0.5 + 1/sqrt(3)) * DBL_EPSILON.  The maximum error in each call to
  // DotProd() below is DBL_EPSILON.  (There is also a small relative error
  // term that is insignificant because we are comparing the result against a
  // constant that is very close to zero.)
  static const double kError = (1.5 + 1/sqrt(3)) * DBL_EPSILON;
  if ((c_->DotProd(a_tangent_) > kError && d.DotProd(a_tangent_) > kError) ||
      (c_->DotProd(b_tangent_) > kError && d.DotProd(b_tangent_) > kError)) {
    return -1;
  }

  // Otherwise, eliminate the cases where two vertices from different edges
  // are equal.  (These cases could be handled in the code below, but we would
  // rather avoid calling ExpensiveSign whenever possible.)
  if (*a_ == *c_ || *a_ == d || *b_ == *c_ || *b_ == d) return 0;

  // Eliminate cases where an input edge is degenerate.  (Note that in most
  // cases, if CD is degenerate then this method is not even called because
  // acb_ and bda have different signs.)
  if (*a_ == *b_ || *c_ == d) return -1;

  // Otherwise it's time to break out the big guns.
  if (acb_ == 0) acb_ = -s2pred::ExpensiveSign(*a_, *b_, *c_);
  S2_DCHECK_NE(acb_, 0);
  if (bda_ == 0) bda_ = s2pred::ExpensiveSign(*a_, *b_, d);
  S2_DCHECK_NE(bda_, 0);
  if (bda_ != acb_) return -1;

  Vector3_d c_cross_d = c_->CrossProd(d);
  int cbd = -s2pred::Sign(*c_, d, *b_, c_cross_d);
  S2_DCHECK_NE(cbd, 0);
  if (cbd != acb_) return -1;
  int dac = s2pred::Sign(*c_, d, *a_, c_cross_d);
  S2_DCHECK_NE(dac, 0);
  return (dac != acb_) ? -1 : 1;
}